

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

void sysbvm_type_setInstanceSizeAndAlignment
               (sysbvm_context_t *context,sysbvm_tuple_t type,size_t instanceSize,
               size_t instanceAlignment)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  
  if ((type & 0xf) == 0 && type != 0) {
    _Var1 = sysbvm_tuple_isDummyValue(type);
    if (!_Var1) {
      sVar2 = sysbvm_tuple_size_encode(context,instanceSize);
      *(sysbvm_tuple_t *)(type + 0x60) = sVar2;
      sVar2 = sysbvm_tuple_size_encode(context,instanceAlignment);
      *(sysbvm_tuple_t *)(type + 0x68) = sVar2;
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_type_setInstanceSizeAndAlignment(sysbvm_context_t *context, sysbvm_tuple_t type, size_t instanceSize, size_t instanceAlignment)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return;
    if(sysbvm_tuple_isDummyValue(type)) return;

    sysbvm_type_tuple_t *typeObject = (sysbvm_type_tuple_t*)type;
    typeObject->instanceSize = sysbvm_tuple_size_encode(context, instanceSize);
    typeObject->instanceAlignment = sysbvm_tuple_size_encode(context, instanceAlignment);
}